

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

string * __thiscall
gnuplotio::Gnuplot::
binfmt<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,undefined8 param_2,undefined8 arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arr_or_rec)

{
  bool bVar1;
  ostream *poVar2;
  bool local_24a;
  plotting_empty_container *anon_var_0;
  undefined1 local_1b0 [8];
  ostringstream tmp;
  string *arr_or_rec_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *arg_local;
  Gnuplot *this_local;
  string *ret;
  
  bVar1 = std::operator==(arr_or_rec,"array");
  local_24a = true;
  if (!bVar1) {
    local_24a = std::operator==(arr_or_rec,"record");
  }
  if (local_24a != false) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::operator<<((ostream *)local_1b0," format=\'");
    top_level_array_sender<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D,gnuplotio::ModeBinfmt>
              (local_1b0,arg);
    poVar2 = std::operator<<((ostream *)local_1b0,"\' ");
    poVar2 = std::operator<<(poVar2,(string *)arr_or_rec);
    std::operator<<(poVar2,"=(");
    top_level_array_sender<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,gnuplotio::Mode1D,gnuplotio::ModeSize>
              (local_1b0,arg);
    std::operator<<((ostream *)local_1b0,")");
    std::operator<<((ostream *)local_1b0," ");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&anon_var_0);
    std::__cxx11::string::~string((string *)&anon_var_0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    return __return_storage_ptr__;
  }
  __assert_fail("(arr_or_rec == \"array\") || (arr_or_rec == \"record\")",
                "/workspace/llm4binary/github/license_c_cmakelists/dstahlke[P]gnuplot-iostream/gnuplot-iostream.h"
                ,0x706,
                "std::string gnuplotio::Gnuplot::binfmt(const T &, const std::string &, OrganizationMode) [T = std::vector<std::pair<double, double>>, OrganizationMode = gnuplotio::Mode1D]"
               );
}

Assistant:

std::string binfmt(const T &arg, const std::string &arr_or_rec, OrganizationMode) {
        assert((arr_or_rec == "array") || (arr_or_rec == "record"));
        std::string ret;
        try {
            std::ostringstream tmp;
            tmp << " format='";
            top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
            tmp << "' " << arr_or_rec << "=(";
            top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
            tmp << ")";
            tmp << " ";
            ret = tmp.str();
        } catch(const plotting_empty_container &) {
            ret = std::string(" format='' ") + arr_or_rec + "=(0) ";
        }
        return ret;
    }